

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::DockNodeRemoveWindow(ImGuiDockNode *node,ImGuiWindow *window,ImGuiID save_dock_id)

{
  long lVar1;
  ImGuiWindow *pIVar2;
  long lVar3;
  ImGuiContext_conflict *ctx;
  int iVar4;
  ImGuiWindow **ppIVar5;
  bool bVar6;
  ImGuiWindow *remaining_window;
  int local_30;
  int tab_count_threshold_for_tab_bar;
  int n;
  bool erased;
  ImGuiContext_conflict *g;
  ImGuiWindow *pIStack_18;
  ImGuiID save_dock_id_local;
  ImGuiWindow *window_local;
  ImGuiDockNode *node_local;
  
  ctx = GImGui;
  pIStack_18 = window;
  window_local = (ImGuiWindow *)node;
  if (window->DockNode != node) {
    __assert_fail("window->DockNode == node",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                  ,0x3506,
                  "void ImGui::DockNodeRemoveWindow(ImGuiDockNode *, ImGuiWindow *, ImGuiID)");
  }
  bVar6 = true;
  if (save_dock_id != 0) {
    bVar6 = save_dock_id == node->ID;
  }
  if (!bVar6) {
    __assert_fail("save_dock_id == 0 || save_dock_id == node->ID",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                  ,0x3509,
                  "void ImGui::DockNodeRemoveWindow(ImGuiDockNode *, ImGuiWindow *, ImGuiID)");
  }
  window->DockNode = (ImGuiDockNode *)0x0;
  window->field_0x3e1 = window->field_0x3e1 & 0xf7;
  window->field_0x3e1 = window->field_0x3e1 & 0xfe;
  window->DockId = save_dock_id;
  window->Flags = window->Flags & 0xfeffffff;
  if (window->ParentWindow != (ImGuiWindow *)0x0) {
    ImVector<ImGuiWindow_*>::find_erase
              (&(window->ParentWindow->DC).ChildWindows,&stack0xffffffffffffffe8);
  }
  UpdateWindowParentAndRootLinks(pIStack_18,pIStack_18->Flags,(ImGuiWindow *)0x0);
  bVar6 = false;
  local_30 = 0;
  do {
    if (*(int *)&window_local->Viewport <= local_30) {
LAB_0020a9f3:
      if (!bVar6) {
        __assert_fail("erased",
                      "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                      ,0x351e,
                      "void ImGui::DockNodeRemoveWindow(ImGuiDockNode *, ImGuiWindow *, ImGuiID)");
      }
      if (*(ImGuiWindow **)&window_local->NameBufLen == pIStack_18) {
        window_local->NameBufLen = 0;
        window_local->MoveId = 0;
      }
      *(byte *)((long)&(window_local->ScrollbarSizes).x + 2) =
           *(byte *)((long)&(window_local->ScrollbarSizes).x + 2) & 0xfd | 2;
      if (*(long *)&(window_local->ViewportPos).y != 0) {
        TabBarRemoveTab(*(ImGuiTabBar **)&(window_local->ViewportPos).y,pIStack_18->ID);
        bVar6 = ImGuiDockNode::IsCentralNode((ImGuiDockNode *)window_local);
        iVar4 = 2;
        if (bVar6) {
          iVar4 = 1;
        }
        if (*(int *)&window_local->Viewport < iVar4) {
          DockNodeRemoveTabBar((ImGuiDockNode *)window_local);
        }
      }
      if ((((*(int *)&window_local->Viewport != 0) ||
           (bVar6 = ImGuiDockNode::IsCentralNode((ImGuiDockNode *)window_local), bVar6)) ||
          (bVar6 = ImGuiDockNode::IsDockSpace((ImGuiDockNode *)window_local), bVar6)) ||
         (pIStack_18->DockId == *(ImGuiID *)&window_local->Name)) {
        if (((*(int *)&window_local->Viewport == 1) &&
            (bVar6 = ImGuiDockNode::IsCentralNode((ImGuiDockNode *)window_local), !bVar6)) &&
           (lVar1._0_4_ = window_local->WindowRounding, lVar1._4_4_ = window_local->WindowBorderSize
           , lVar1 != 0)) {
          ppIVar5 = ImVector<ImGuiWindow_*>::operator[]
                              ((ImVector<ImGuiWindow_*> *)&window_local->Viewport,0);
          pIVar2 = *ppIVar5;
          if (((*(byte *)(*(long *)&window_local->WindowRounding + 0xc6) & 1) != 0) &&
             (bVar6 = ImGuiDockNode::IsRootNode((ImGuiDockNode *)window_local), bVar6)) {
            lVar3._0_4_ = window_local->WindowRounding;
            lVar3._4_4_ = window_local->WindowBorderSize;
            if (*(long *)(*(long *)(*(long *)&window_local->WindowRounding + 0x30) + 0x80) != lVar3)
            {
              __assert_fail("node->HostWindow->Viewport->Window == node->HostWindow",
                            "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                            ,0x353a,
                            "void ImGui::DockNodeRemoveWindow(ImGuiDockNode *, ImGuiWindow *, ImGuiID)"
                           );
            }
            *(ImGuiWindow **)(*(long *)(*(long *)&window_local->WindowRounding + 0x30) + 0x80) =
                 pIVar2;
            **(ImGuiID **)(*(long *)&window_local->WindowRounding + 0x30) = pIVar2->ID;
          }
          pIVar2->Collapsed = (bool)(*(byte *)(*(long *)&window_local->WindowRounding + 0xca) & 1);
        }
        DockNodeUpdateVisibleFlag((ImGuiDockNode *)window_local);
      }
      else {
        DockContextRemoveNode(ctx,(ImGuiDockNode *)window_local,true);
      }
      return;
    }
    ppIVar5 = ImVector<ImGuiWindow_*>::operator[]
                        ((ImVector<ImGuiWindow_*> *)&window_local->Viewport,local_30);
    if (*ppIVar5 == pIStack_18) {
      ImVector<ImGuiWindow_*>::erase
                ((ImVector<ImGuiWindow_*> *)&window_local->Viewport,
                 (ImGuiWindow **)(*(long *)&window_local->ViewportId + (long)local_30 * 8));
      bVar6 = true;
      goto LAB_0020a9f3;
    }
    local_30 = local_30 + 1;
  } while( true );
}

Assistant:

static void ImGui::DockNodeRemoveWindow(ImGuiDockNode* node, ImGuiWindow* window, ImGuiID save_dock_id)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(window->DockNode == node);
    //IM_ASSERT(window->RootWindowDockTree == node->HostWindow);
    //IM_ASSERT(window->LastFrameActive < g.FrameCount);    // We may call this from Begin()
    IM_ASSERT(save_dock_id == 0 || save_dock_id == node->ID);
    IMGUI_DEBUG_LOG_DOCKING("DockNodeRemoveWindow node 0x%08X window '%s'\n", node->ID, window->Name);

    window->DockNode = NULL;
    window->DockIsActive = window->DockTabWantClose = false;
    window->DockId = save_dock_id;
    window->Flags &= ~ImGuiWindowFlags_ChildWindow;
    if (window->ParentWindow)
        window->ParentWindow->DC.ChildWindows.find_erase(window);
    UpdateWindowParentAndRootLinks(window, window->Flags, NULL); // Update immediately

    // Remove window
    bool erased = false;
    for (int n = 0; n < node->Windows.Size; n++)
        if (node->Windows[n] == window)
        {
            node->Windows.erase(node->Windows.Data + n);
            erased = true;
            break;
        }
    if (!erased)
        IM_ASSERT(erased);
    if (node->VisibleWindow == window)
        node->VisibleWindow = NULL;

    // Remove tab and possibly tab bar
    node->WantHiddenTabBarUpdate = true;
    if (node->TabBar)
    {
        TabBarRemoveTab(node->TabBar, window->ID);
        const int tab_count_threshold_for_tab_bar = node->IsCentralNode() ? 1 : 2;
        if (node->Windows.Size < tab_count_threshold_for_tab_bar)
            DockNodeRemoveTabBar(node);
    }

    if (node->Windows.Size == 0 && !node->IsCentralNode() && !node->IsDockSpace() && window->DockId != node->ID)
    {
        // Automatic dock node delete themselves if they are not holding at least one tab
        DockContextRemoveNode(&g, node, true);
        return;
    }

    if (node->Windows.Size == 1 && !node->IsCentralNode() && node->HostWindow)
    {
        ImGuiWindow* remaining_window = node->Windows[0];
        if (node->HostWindow->ViewportOwned && node->IsRootNode())
        {
            // Transfer viewport back to the remaining loose window
            IMGUI_DEBUG_LOG_VIEWPORT("Node %08X transfer Viewport %08X=>%08X for Window '%s'\n", node->ID, node->HostWindow->Viewport->ID, remaining_window->ID, remaining_window->Name);
            IM_ASSERT(node->HostWindow->Viewport->Window == node->HostWindow);
            node->HostWindow->Viewport->Window = remaining_window;
            node->HostWindow->Viewport->ID = remaining_window->ID;
        }
        remaining_window->Collapsed = node->HostWindow->Collapsed;
    }

    // Update visibility immediately is required so the DockNodeUpdateRemoveInactiveChilds() processing can reflect changes up the tree
    DockNodeUpdateVisibleFlag(node);
}